

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O2

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _c;
  int _w;
  int _h;
  size_t _elemsize;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int local_60;
  
  _c = bottom_blob->c;
  uVar2 = this->group;
  local_60 = -100;
  if (_c % (int)uVar2 == 0) {
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _elemsize = bottom_blob->elemsize;
    uVar8 = _c / (int)uVar2;
    if (this->reverse == 0) {
      uVar8 = uVar2;
    }
    uVar2 = _c / (int)uVar8;
    Mat::create(top_blob,_w,_h,_c,_elemsize,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = (ulong)uVar2;
      }
      local_60 = 0;
      uVar1 = uVar8;
      if ((int)uVar8 < 1) {
        uVar1 = 0;
      }
      lVar6 = 0;
      for (uVar4 = 0; lVar5 = lVar6, uVar7 = uVar3, uVar9 = uVar4, uVar4 != uVar1; uVar4 = uVar4 + 1
          ) {
        while (uVar7 != 0) {
          memcpy((void *)(top_blob->cstep * uVar9 * top_blob->elemsize + (long)top_blob->data),
                 (void *)(bottom_blob->cstep * lVar5 * bottom_blob->elemsize +
                         (long)bottom_blob->data),(long)_h * (long)_w * _elemsize);
          lVar5 = lVar5 + 1;
          uVar7 = uVar7 - 1;
          uVar9 = uVar9 + (long)(int)uVar8;
        }
        lVar6 = lVar6 + (int)uVar2;
      }
    }
  }
  return local_60;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0)
    {
        // reject invalid group
        return -100;
    }

    int _group = reverse ? channels / group : group;
    int channels_per_group = channels / _group;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = (size_t)w * h * elemsize;
    for (int i = 0; i < _group; i++)
    {
        for (int j = 0; j < channels_per_group; j++)
        {
            int src_q = channels_per_group * i + j;
            int dst_q = _group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }

    return 0;
}